

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

Vec_Int_t * Abc_FrameDeriveStatusArray2(Vec_Ptr_t *vCexes)

{
  Vec_Int_t *p;
  void *pvVar1;
  int i;
  
  i = 0;
  if (vCexes == (Vec_Ptr_t *)0x0) {
    p = (Vec_Int_t *)0x0;
  }
  else {
    p = Vec_IntAlloc(vCexes->nSize);
    Vec_IntFill(p,vCexes->nSize,-1);
    for (; i < vCexes->nSize; i = i + 1) {
      pvVar1 = Vec_PtrEntry(vCexes,i);
      if (pvVar1 != (void *)0x0) {
        if (pvVar1 == (void *)0x1) {
          Vec_IntWriteEntry(p,i,1);
          Vec_PtrWriteEntry(vCexes,i,(void *)0x0);
        }
        else {
          Vec_IntWriteEntry(p,i,0);
        }
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_FrameDeriveStatusArray2( Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vStatuses;
    Abc_Cex_t * pCex;
    int i;
    if ( vCexes == NULL )
        return NULL;
    vStatuses = Vec_IntAlloc( Vec_PtrSize(vCexes) );
    Vec_IntFill( vStatuses, Vec_PtrSize(vCexes), -1 ); // assume UNDEC
    Vec_PtrForEachEntry( Abc_Cex_t *, vCexes, pCex, i )
        if ( pCex == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
        {
            Vec_IntWriteEntry( vStatuses, i, 1 ); // set this output as UNSAT
            Vec_PtrWriteEntry( vCexes, i, NULL );
        }
        else if ( pCex != NULL )
            Vec_IntWriteEntry( vStatuses, i, 0 ); // set this output as SAT
    return vStatuses;
}